

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall
SQCompiler::ParseTableOrClass(SQCompiler *this,SQInteger separator,SQInteger terminator)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQFuncState *unaff_RBP;
  SQFuncState *pSVar6;
  long val;
  ulong unaff_R15;
  SQObject SVar7;
  SQInstruction local_70;
  SQObjectType local_68;
  uchar local_64;
  byte bStack_63;
  uchar local_62;
  uchar uStack_61;
  SQObjectValue local_60;
  SQLexer *local_58;
  SQUnsignedInteger local_50;
  uint local_48;
  byte local_44;
  SQUnsignedInteger local_40;
  SQUnsignedInteger local_38;
  
  SVar2 = this->_token;
  local_40 = (this->_fs->_instructions)._size;
  local_50 = separator;
  local_38 = terminator;
  if (SVar2 == terminator) {
    val = 0;
  }
  else {
    local_58 = &this->_lex;
    val = 0;
    do {
      if (local_50 == 0x3b) {
        if (SVar2 == 0x140) {
          pSVar6 = this->_fs;
          SVar5 = SQFuncState::PushTarget(pSVar6,-1);
          bStack_63 = (uchar)SVar5;
          local_64 = '!';
          local_68 = 0;
          _local_62 = 0;
          SQFuncState::AddInstruction(pSVar6,(SQInstruction *)&stack0xffffffffffffff98);
          SVar5 = SQLexer::Lex(local_58);
          this->_token = SVar5;
          ParseTableOrClass(this,0x2c,0x141);
          unaff_R15 = CONCAT71((int7)(unaff_R15 >> 8),1);
        }
        else {
          unaff_R15 = 0;
        }
        if (this->_token == 0x142) {
          SVar5 = SQLexer::Lex(local_58);
          this->_token = SVar5;
          unaff_RBP = (SQFuncState *)CONCAT71((int7)((ulong)unaff_RBP >> 8),2);
        }
        else {
          unaff_RBP = (SQFuncState *)0x0;
        }
      }
      else {
        unaff_RBP = (SQFuncState *)0x0;
        unaff_R15 = 0;
      }
      lVar1 = this->_token;
      _local_44 = SUB84(unaff_RBP,0);
      if (lVar1 < 0x11d) {
        if (lVar1 == 0x5b) {
          SVar5 = SQLexer::Lex(local_58);
          this->_token = SVar5;
          CommaExpr(this);
          Expect(this,0x5d);
LAB_0011ba36:
          SVar5 = 0x3d;
        }
        else {
          if ((lVar1 != 0x103) || (local_50 != 0x2c)) goto LAB_0011b8e4;
          pSVar6 = this->_fs;
          SVar5 = SQFuncState::PushTarget(pSVar6,-1);
          unaff_RBP = this->_fs;
          SVar7 = Expect(this,0x103);
          local_60 = SVar7._unVal;
          local_68 = SVar7._type;
          SVar3 = SQFuncState::GetConstant(unaff_RBP,(SQObject *)&stack0xffffffffffffff98);
          local_70.op = '\x01';
          local_70._arg0 = (uchar)SVar5;
          local_70._arg1 = (SQInt32)SVar3;
          local_70._arg2 = '\0';
          local_70._arg3 = '\0';
          SQFuncState::AddInstruction(pSVar6,&local_70);
          SVar5 = 0x3a;
        }
        Expect(this,SVar5);
        Expression(this);
      }
      else {
        if ((lVar1 != 0x136) && (lVar1 != 0x11d)) {
LAB_0011b8e4:
          pSVar6 = this->_fs;
          SVar5 = SQFuncState::PushTarget(pSVar6,-1);
          unaff_RBP = this->_fs;
          SVar7 = Expect(this,0x102);
          local_60 = SVar7._unVal;
          local_68 = SVar7._type;
          SVar3 = SQFuncState::GetConstant(unaff_RBP,(SQObject *)&stack0xffffffffffffff98);
          local_70.op = '\x01';
          local_70._arg0 = (uchar)SVar5;
          local_70._arg1 = (SQInt32)SVar3;
          local_70._arg2 = '\0';
          local_70._arg3 = '\0';
          SQFuncState::AddInstruction(pSVar6,&local_70);
          goto LAB_0011ba36;
        }
        SVar5 = SQLexer::Lex(local_58);
        this->_token = SVar5;
        local_48 = (uint)unaff_R15;
        if (lVar1 == 0x11d) {
          SVar7 = Expect(this,0x102);
        }
        else {
          SVar7 = SQFuncState::CreateString(this->_fs,"constructor",-1);
        }
        local_60 = SVar7._unVal;
        local_68 = SVar7._type;
        Expect(this,0x28);
        pSVar6 = this->_fs;
        SVar5 = SQFuncState::PushTarget(pSVar6,-1);
        unaff_RBP = (SQFuncState *)&stack0xffffffffffffff98;
        SVar3 = SQFuncState::GetConstant(this->_fs,(SQObject *)unaff_RBP);
        local_70.op = '\x01';
        local_70._arg0 = (uchar)SVar5;
        local_70._arg1 = (SQInt32)SVar3;
        local_70._arg2 = '\0';
        local_70._arg3 = '\0';
        SQFuncState::AddInstruction(pSVar6,&local_70);
        CreateFunction(this,(SQObject *)unaff_RBP,false);
        pSVar6 = this->_fs;
        SVar5 = SQFuncState::PushTarget(pSVar6,-1);
        local_70.op = '0';
        local_70._arg0 = (uchar)SVar5;
        local_70._arg1 = (int)(this->_fs->_functions)._size + -1;
        local_70._arg2 = '\0';
        local_70._arg3 = '\0';
        SQFuncState::AddInstruction(pSVar6,&local_70);
        unaff_R15 = (ulong)local_48;
      }
      if (this->_token == local_50) {
        SVar5 = SQLexer::Lex(local_58);
        this->_token = SVar5;
      }
      SVar5 = SQFuncState::PopTarget(this->_fs);
      SVar3 = SQFuncState::PopTarget(this->_fs);
      if ((byte)unaff_R15 != 0) {
        SQFuncState::PopTarget(this->_fs);
      }
      SVar4 = SQFuncState::TopTarget(this->_fs);
      if (local_50 == 0x2c) {
        pSVar6 = this->_fs;
        _local_64 = 0xff0b;
      }
      else {
        bStack_63 = (byte)unaff_R15 | local_44;
        unaff_R15 = CONCAT71((int7)(unaff_R15 >> 8),bStack_63);
        pSVar6 = this->_fs;
        local_64 = ':';
      }
      local_68 = (SQObjectType)SVar4;
      uStack_61 = (uchar)SVar5;
      local_62 = (uchar)SVar3;
      SQFuncState::AddInstruction(pSVar6,(SQInstruction *)&stack0xffffffffffffff98);
      SVar2 = this->_token;
      val = val + 1;
    } while (SVar2 != local_38);
  }
  if (local_50 == 0x2c) {
    SQFuncState::SetIntructionParam(this->_fs,local_40 - 1,1,val);
  }
  SVar5 = SQLexer::Lex(&this->_lex);
  this->_token = SVar5;
  return;
}

Assistant:

void ParseTableOrClass(SQInteger separator,SQInteger terminator)
    {
        SQInteger tpos = _fs->GetCurrentPos(),nkeys = 0;
        while(_token != terminator) {
            bool hasattrs = false;
            bool isstatic = false;
            //check if is an attribute
            if(separator == ';') {
                if(_token == TK_ATTR_OPEN) {
                    _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE); Lex();
                    ParseTableOrClass(',',TK_ATTR_CLOSE);
                    hasattrs = true;
                }
                if(_token == TK_STATIC) {
                    isstatic = true;
                    Lex();
                }
            }
            switch(_token) {
            case TK_FUNCTION:
            case TK_CONSTRUCTOR:{
                SQInteger tk = _token;
                Lex();
                SQObject id = tk == TK_FUNCTION ? Expect(TK_IDENTIFIER) : _fs->CreateString(_SC("constructor"));
                Expect(_SC('('));
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                CreateFunction(id);
                _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
                                }
                                break;
            case _SC('['):
                Lex(); CommaExpr(); Expect(_SC(']'));
                Expect(_SC('=')); Expression();
                break;
            case TK_STRING_LITERAL: //JSON
                if(separator == ',') { //only works for tables
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_STRING_LITERAL)));
                    Expect(_SC(':')); Expression();
                    break;
                }
            default :
                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                Expect(_SC('=')); Expression();
            }
            if(_token == separator) Lex();//optional comma/semicolon
            nkeys++;
            SQInteger val = _fs->PopTarget();
            SQInteger key = _fs->PopTarget();
            SQInteger attrs = hasattrs ? _fs->PopTarget():-1;
            ((void)attrs);
            assert((hasattrs && (attrs == key-1)) || !hasattrs);
            unsigned char flags = (hasattrs?NEW_SLOT_ATTRIBUTES_FLAG:0)|(isstatic?NEW_SLOT_STATIC_FLAG:0);
            SQInteger table = _fs->TopTarget(); //<<BECAUSE OF THIS NO COMMON EMIT FUNC IS POSSIBLE
            if(separator == _SC(',')) { //hack recognizes a table from the separator
                _fs->AddInstruction(_OP_NEWSLOT, 0xFF, table, key, val);
            }
            else {
                _fs->AddInstruction(_OP_NEWSLOTA, flags, table, key, val); //this for classes only as it invokes _newmember
            }
        }
        if(separator == _SC(',')) //hack recognizes a table from the separator
            _fs->SetIntructionParam(tpos, 1, nkeys);
        Lex();
    }